

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O0

deUint32 glu::getGLCompareFunc(CompareMode compareMode)

{
  InternalError *this;
  allocator<char> local_31;
  string local_30;
  CompareMode local_10;
  deUint32 local_c;
  CompareMode compareMode_local;
  
  switch(compareMode) {
  case COMPAREMODE_NONE:
    local_c = 0;
    break;
  case COMPAREMODE_LESS:
    local_c = 0x201;
    break;
  case COMPAREMODE_LESS_OR_EQUAL:
    local_c = 0x203;
    break;
  case COMPAREMODE_GREATER:
    local_c = 0x204;
    break;
  case COMPAREMODE_GREATER_OR_EQUAL:
    local_c = 0x206;
    break;
  case COMPAREMODE_EQUAL:
    local_c = 0x202;
    break;
  case COMPAREMODE_NOT_EQUAL:
    local_c = 0x205;
    break;
  case COMPAREMODE_ALWAYS:
    local_c = 0x207;
    break;
  case COMPAREMODE_NEVER:
    local_c = 0x200;
    break;
  default:
    local_10 = compareMode;
    this = (InternalError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Can\'t map compare mode",&local_31);
    tcu::InternalError::InternalError(this,&local_30);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  }
  return local_c;
}

Assistant:

deUint32 getGLCompareFunc (tcu::Sampler::CompareMode compareMode)
{
	DE_ASSERT(compareMode != tcu::Sampler::COMPAREMODE_NONE);
	switch (compareMode)
	{
		case tcu::Sampler::COMPAREMODE_NONE:				return GL_NONE;
		case tcu::Sampler::COMPAREMODE_LESS:				return GL_LESS;
		case tcu::Sampler::COMPAREMODE_LESS_OR_EQUAL:		return GL_LEQUAL;
		case tcu::Sampler::COMPAREMODE_GREATER:				return GL_GREATER;
		case tcu::Sampler::COMPAREMODE_GREATER_OR_EQUAL:	return GL_GEQUAL;
		case tcu::Sampler::COMPAREMODE_EQUAL:				return GL_EQUAL;
		case tcu::Sampler::COMPAREMODE_NOT_EQUAL:			return GL_NOTEQUAL;
		case tcu::Sampler::COMPAREMODE_ALWAYS:				return GL_ALWAYS;
		case tcu::Sampler::COMPAREMODE_NEVER:				return GL_NEVER;
		default:
			throw tcu::InternalError("Can't map compare mode");
	}
}